

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void Diligent::DefineInterfaceVar
               (int location,char *interpolation,char *inout,String *ParamType,String *ParamName,
               stringstream *OutSS)

{
  ostream *poVar1;
  size_t sVar2;
  char local_3b [3];
  String *local_38;
  
  local_38 = ParamName;
  if (-1 < location) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(OutSS + 0x10),"layout(location = ",0x12);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)(OutSS + 0x10),location);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  }
  if ((interpolation != (char *)0x0) && (*interpolation != '\0')) {
    sVar2 = strlen(interpolation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(OutSS + 0x10),interpolation,sVar2);
    local_3b[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(OutSS + 0x10),local_3b,1);
  }
  poVar1 = (ostream *)(OutSS + 0x10);
  if (inout == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(inout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,inout,sVar2);
  }
  local_3b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 1,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(ParamType->_M_dataplus)._M_p,ParamType->_M_string_length);
  local_3b[2] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 2,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  return;
}

Assistant:

void DefineInterfaceVar(int location, const char* interpolation, const char* inout, const String& ParamType, const String& ParamName, std::stringstream& OutSS)
{
    if (location >= 0)
    {
        OutSS << "layout(location = " << location << ") ";
    }
    if (interpolation != nullptr && interpolation[0] != '\0')
    {
        OutSS << interpolation << ' ';
    }
    OutSS << inout << ' ' << ParamType << ' ' << ParamName << ";\n";
}